

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

void __thiscall kj::anon_unknown_8::DiskHandle::zero(DiskHandle *this,uint64_t offset,uint64_t size)

{
  ulong uVar1;
  Fault FVar2;
  size_t sVar3;
  int iVar4;
  Exception *__iovec;
  ssize_t sVar5;
  Exception *pEVar6;
  ulong uVar7;
  size_t elementCount;
  Fault f_1;
  Array<iovec> iov_heap;
  Fault f_2;
  iovec iov_stack [16];
  undefined8 *local_188;
  Fault local_170;
  Fault local_168;
  size_t sStack_160;
  undefined8 *local_158;
  Fault local_148;
  undefined8 uStack_140;
  void *local_138;
  size_t sStack_130;
  
  do {
    iVar4 = fallocate((this->fd).fd,3,offset,size);
    if (-1 < iVar4) {
      return;
    }
    iVar4 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar4 == -1);
  if (iVar4 == 0) {
    return;
  }
  if (iVar4 != 0x5f) {
    local_168.exception = (Exception *)0x0;
    local_138 = (void *)0x0;
    sStack_130 = 0;
    kj::_::Debug::Fault::init
              (&local_168,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
              );
    kj::_::Debug::Fault::~Fault(&local_168);
    return;
  }
  uVar1 = size + 0xfff;
  uVar7 = uVar1 >> 0xc;
  elementCount = 0x400;
  if (uVar7 < 0x400) {
    elementCount = uVar7;
  }
  if (uVar1 < 0x11000) {
    local_168.exception = (Exception *)0x0;
    sStack_160 = 0;
    local_158 = (undefined8 *)0x0;
    __iovec = (Exception *)&stack0xfffffffffffffec8;
    local_188 = (undefined8 *)0x0;
    if (uVar1 < 0x1000) goto LAB_004a0999;
  }
  else {
    __iovec = (Exception *)
              kj::_::HeapArrayDisposer::allocateImpl
                        (0x10,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                         (_func_void_void_ptr *)0x0);
    local_188 = &kj::_::HeapArrayDisposer::instance;
    local_158 = &kj::_::HeapArrayDisposer::instance;
    local_168.exception = __iovec;
    sStack_160 = elementCount;
  }
  pEVar6 = __iovec;
  do {
    (pEVar6->ownFile).content.ptr = (char *)"";
    (pEVar6->ownFile).content.size_ = 0x1000;
    pEVar6 = (Exception *)&(pEVar6->ownFile).content.disposer;
  } while (pEVar6 != (Exception *)(__iovec->trace + elementCount * 2 + -10));
LAB_004a0999:
  sVar3 = sStack_160;
  FVar2.exception = local_168.exception;
  if (size != 0) {
    do {
      if ((size < elementCount << 0xc) && ((size & 0xfff) != 0)) {
        *(uint64_t *)((long)__iovec->trace + ((size >> 8 & 0xfffffffffffffff0) - 0x48)) =
             size & 0xfff;
      }
      while( true ) {
        sVar5 = pwritev((this->fd).fd,(iovec *)__iovec,(int)uVar7,offset);
        if (-1 < sVar5) break;
        iVar4 = kj::_::Debug::getOsErrorNumber(false);
        if (iVar4 != -1) {
          if (iVar4 != 0) {
            local_170.exception = (Exception *)0x0;
            local_148.exception = (Exception *)0x0;
            uStack_140 = 0;
            kj::_::Debug::Fault::init
                      (&local_170,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                      );
            kj::_::Debug::Fault::fatal(&local_170);
          }
          goto LAB_004a0a32;
        }
      }
      if (sVar5 == 0) {
LAB_004a0a32:
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                  (&local_148,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                   ,0x1b0,FAILED,"n > 0","\"pwrite() returned zero?\"",
                   (char (*) [24])"pwrite() returned zero?");
        kj::_::Debug::Fault::fatal(&local_148);
      }
      offset = offset + sVar5;
      size = size - sVar5;
    } while (size != 0);
  }
  if (FVar2.exception != (Exception *)0x0) {
    local_168.exception = (Exception *)0x0;
    sStack_160 = 0;
    (**(code **)*local_188)(local_188,FVar2.exception,0x10,sVar3,sVar3,0);
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t size) const {
#ifdef FALLOC_FL_PUNCH_HOLE
    KJ_SYSCALL_HANDLE_ERRORS(
        fallocate(fd, FALLOC_FL_PUNCH_HOLE | FALLOC_FL_KEEP_SIZE, offset, size)) {
      case EOPNOTSUPP:
        // fall back to below
        break;
      default:
        KJ_FAIL_SYSCALL("fallocate(FALLOC_FL_PUNCH_HOLE)", error) { return; }
    } else {
      return;
    }
#endif

    static const byte ZEROS[4096] = { 0 };

#if __APPLE__ || __CYGWIN__ || (defined(__ANDROID__) && __ANDROID_API__ < 24)
    // Mac & Cygwin & Android API levels 23 and lower doesn't have pwritev().
    while (size > sizeof(ZEROS)) {
      write(offset, ZEROS);
      size -= sizeof(ZEROS);
      offset += sizeof(ZEROS);
    }
    write(offset, kj::arrayPtr(ZEROS, size));
#else
    // Use a 4k buffer of zeros amplified by iov to write zeros with as few syscalls as possible.
    size_t count = (size + sizeof(ZEROS) - 1) / sizeof(ZEROS);
    const size_t iovmax = miniposix::iovMax(count);
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(iovmax, count), 16, 256);

    for (auto& item: iov) {
      item.iov_base = const_cast<byte*>(ZEROS);
      item.iov_len = sizeof(ZEROS);
    }

    while (size > 0) {
      size_t iovCount;
      if (size >= iov.size() * sizeof(ZEROS)) {
        iovCount = iov.size();
      } else {
        iovCount = size / sizeof(ZEROS);
        size_t rem = size % sizeof(ZEROS);
        if (rem > 0) {
          iov[iovCount++].iov_len = rem;
        }
      }

      ssize_t n;
      KJ_SYSCALL(n = pwritev(fd, iov.begin(), count, offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");

      offset += n;
      size -= n;
    }
#endif
  }